

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O3

void __thiscall QThreadData::~QThreadData(QThreadData *this)

{
  __pointer_type pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  
  if ((AtomicType)(this->threadId).super_QBasicAtomicPointer<void>._q_value._M_b._M_p ==
      QCoreApplicationPrivate::theMainThreadId._q_value._M_b._M_p) {
    QCoreApplicationPrivate::theMainThread._q_value._M_b._M_p = (AtomicType)(__base_type)0x0;
    QCoreApplicationPrivate::theMainThreadId._q_value._M_b._M_p = (AtomicType)(__base_type)0x0;
    clearCurrentThreadData();
  }
  pQVar1 = (this->thread).super_QBasicAtomicPointer<QThread>._q_value._M_b._M_p;
  (this->thread).super_QBasicAtomicPointer<QThread>._q_value._M_b._M_p = (__pointer_type)0x0;
  if (pQVar1 != (__pointer_type)0x0) {
    (*(pQVar1->super_QObject)._vptr_QObject[4])();
  }
  clearEvents(this);
  pDVar2 = (this->tls).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->tls).d.d)->super_QArrayData,8,0x10);
    }
  }
  QMutex::~QMutex(&(this->postEventList).mutex);
  pDVar3 = (this->postEventList).super_QList<QPostEvent>.d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> +
         -1);
    UNLOCK();
    if ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0)
    {
      QArrayData::deallocate
                (&((this->postEventList).super_QList<QPostEvent>.d.d)->super_QArrayData,0x18,0x10);
    }
  }
  pDVar4 = (this->eventLoops).super_QList<QEventLoop_*>.d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value =
         (Type)((int)(pDVar4->super_QArrayData).ref_._q_value + -1);
    UNLOCK();
    if ((__atomic_base<int>)*(__int_type_conflict *)&(pDVar4->super_QArrayData).ref_._q_value ==
        (__atomic_base<int>)0x0) {
      QArrayData::deallocate
                (&((this->eventLoops).super_QList<QEventLoop_*>.d.d)->super_QArrayData,8,0x10);
      return;
    }
  }
  return;
}

Assistant:

QThreadData::~QThreadData()
{
#if QT_CONFIG(thread)
    Q_ASSERT(_ref.loadRelaxed() == 0);
#endif

    if (threadId.loadAcquire() == QCoreApplicationPrivate::theMainThreadId.loadAcquire()) {
        QCoreApplicationPrivate::theMainThread.storeRelease(nullptr);
        QCoreApplicationPrivate::theMainThreadId.storeRelaxed(nullptr);
        QThreadData::clearCurrentThreadData();
    }

    // ~QThread() sets thread to nullptr, so if it isn't null here, it's
    // because we're being run before the main object itself. This can only
    // happen for QAdoptedThread. Note that both ~QThreadPrivate() and
    // ~QObjectPrivate() will deref this object again, but that is acceptable
    // because this destructor is still running (the _ref sub-object has not
    // been destroyed) and there's no reentrancy. The refcount will become
    // negative, but that's acceptable.
    QThread *t = thread.loadAcquire();
    thread.storeRelease(nullptr);
    delete t;

    clearEvents();

    // fprintf(stderr, "QThreadData %p destroyed\n", this);
}